

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_FormatParagraph::test_method(test_FormatParagraph *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string file;
  const_string file_00;
  string_view in;
  const_string file_01;
  string_view in_00;
  const_string file_02;
  string_view in_01;
  const_string file_03;
  string_view in_02;
  const_string file_04;
  string_view in_03;
  const_string file_05;
  string_view in_04;
  const_string file_06;
  string_view in_05;
  const_string file_07;
  string_view in_06;
  const_string file_08;
  string_view in_07;
  const_string file_09;
  string_view in_08;
  const_string file_10;
  string_view in_09;
  const_string file_11;
  string_view in_10;
  const_string file_12;
  string_view in_11;
  const_string file_13;
  string_view in_12;
  const_string file_14;
  string_view in_13;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x3f4;
  file.m_begin = (iterator)&local_68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a0 = "";
  FormatParagraph_abi_cxx11_(&local_58,(string_view)(ZEXT816(0xc694e1) << 0x40),0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_98,&local_a8,0x3f4,1,2,psVar2,"FormatParagraph(\"\", 79, 0)","","\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x3f5;
  file_00.m_begin = (iterator)&local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,msg_00
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d0 = "";
  in._M_str = "test";
  in._M_len = 4;
  FormatParagraph_abi_cxx11_(&local_58,in,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_98,&local_d8,0x3f5,1,2,psVar2,"FormatParagraph(\"test\", 79, 0)","test",
             "\"test\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x3f6;
  file_01.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,msg_01
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  in_00._M_str = " test";
  in_00._M_len = 5;
  FormatParagraph_abi_cxx11_(&local_58,in_00,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_98,&local_108,0x3f6,1,2,psVar2,"FormatParagraph(\" test\", 79, 0)"," test",
             "\" test\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x3f7;
  file_02.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_128,
             msg_02);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  in_01._M_str = "test test";
  in_01._M_len = 9;
  FormatParagraph_abi_cxx11_(&local_58,in_01,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_98,&local_138,0x3f7,1,2,psVar2,"FormatParagraph(\"test test\", 79, 0)",
             "test test","\"test test\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x3f8;
  file_03.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_158,
             msg_03);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  in_02._M_str = "test test";
  in_02._M_len = 9;
  FormatParagraph_abi_cxx11_(&local_58,in_02,4,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
            (&local_98,&local_168,0x3f8,1,2,psVar2,"FormatParagraph(\"test test\", 4, 0)",
             "test\ntest","\"test\\ntest\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar2;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x3f9;
  file_04.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_188,
             msg_04);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_190 = "";
  in_03._M_str = "testerde test";
  in_03._M_len = 0xd;
  FormatParagraph_abi_cxx11_(&local_58,in_03,4,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (&local_98,&local_198,0x3f9,1,2,psVar2,"FormatParagraph(\"testerde test\", 4, 0)",
             "testerde\ntest","\"testerde\\ntest\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar1;
  file_05.m_end = (iterator)0x3fa;
  file_05.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1b8,
             msg_05);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  in_04._M_str = "test test";
  in_04._M_len = 9;
  FormatParagraph_abi_cxx11_(&local_58,in_04,4,4);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (&local_98,&local_1c8,0x3fa,1,2,psVar2,"FormatParagraph(\"test test\", 4, 4)",
             "test\n    test","\"test\\n    test\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)psVar2;
  msg_06.m_begin = pvVar1;
  file_06.m_end = (iterator)0x3fd;
  file_06.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1e8,
             msg_06);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  in_05._M_str = "test test\nabc";
  in_05._M_len = 0xd;
  FormatParagraph_abi_cxx11_(&local_58,in_05,4,4);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
            (&local_98,&local_1f8,0x3fd,1,2,psVar2,"FormatParagraph(\"test test\\nabc\", 4, 4)",
             "test\n    test\nabc","\"test\\n    test\\nabc\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)psVar2;
  msg_07.m_begin = pvVar1;
  file_07.m_end = (iterator)0x3ff;
  file_07.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_218,
             msg_07);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_220 = "";
  in_06._M_str = 
  "This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length until it gets here"
  ;
  in_06._M_len = 0x7d;
  FormatParagraph_abi_cxx11_(&local_58,in_06,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[126]>
            (&local_98,&local_228,0x3ff,1,2,psVar2,
             "FormatParagraph(\"This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length until it gets here\", 79)"
             ,
             "This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\nuntil it gets here"
             ,
             "\"This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\\nuntil it gets here\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)psVar2;
  msg_08.m_begin = pvVar1;
  file_08.m_end = (iterator)0x402;
  file_08.m_begin = (iterator)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_248,
             msg_08);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_250 = "";
  in_07._M_str = 
  "a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p"
  ;
  in_07._M_len = 100;
  FormatParagraph_abi_cxx11_(&local_58,in_07,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[101]>
            (&local_98,&local_258,0x402,1,2,psVar2,
             "FormatParagraph(\"a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p\", 79)"
             ,
             "a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p"
             ,
             "\"a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\nf g h i j k l m n o p\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)psVar2;
  msg_09.m_begin = pvVar1;
  file_09.m_end = (iterator)0x403;
  file_09.m_begin = (iterator)&local_268;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_278,
             msg_09);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_280 = "";
  in_08._M_str = 
  "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p"
  ;
  in_08._M_len = 0x66;
  FormatParagraph_abi_cxx11_(&local_58,in_08,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[103]>
            (&local_98,&local_288,0x403,1,2,psVar2,
             "FormatParagraph(\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p\", 79)"
             ,
             "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p"
             ,
             "\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\nf g h i j k l m n o p\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)psVar2;
  msg_10.m_begin = pvVar1;
  file_10.m_end = (iterator)0x405;
  file_10.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2a8,
             msg_10);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2b0 = "";
  in_09._M_str = 
  "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg h i j k"
  ;
  in_09._M_len = 0xa3;
  FormatParagraph_abi_cxx11_(&local_58,in_09,0x4f,4);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[172]>
            (&local_98,&local_2b8,0x405,1,2,psVar2,
             "FormatParagraph(\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg h i j k\", 79, 4)"
             ,
             "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\n    h i j k"
             ,
             "\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\\n    h i j k\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)psVar2;
  msg_11.m_begin = pvVar1;
  file_11.m_end = (iterator)0x407;
  file_11.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2d8,
             msg_11);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2e0 = "";
  in_10._M_str = 
  "This is a very long test string. This is a second sentence in the very long test string.";
  in_10._M_len = 0x58;
  FormatParagraph_abi_cxx11_(&local_58,in_10,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[89]>
            (&local_98,&local_2e8,0x407,1,2,psVar2,
             "FormatParagraph(\"This is a very long test string. This is a second sentence in the very long test string.\", 79)"
             ,
             "This is a very long test string. This is a second sentence in the very long\ntest string."
             ,
             "\"This is a very long test string. This is a second sentence in the very long\\ntest string.\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)psVar2;
  msg_12.m_begin = pvVar1;
  file_12.m_end = (iterator)0x408;
  file_12.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_308,
             msg_12);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_310 = "";
  in_11._M_str = 
  "This is a very long test string.\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string."
  ;
  in_11._M_len = 0x8f;
  FormatParagraph_abi_cxx11_(&local_58,in_11,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[144]>
            (&local_98,&local_318,0x408,1,2,psVar2,
             "FormatParagraph(\"This is a very long test string.\\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.\", 79)"
             ,
             "This is a very long test string.\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string."
             ,
             "\"This is a very long test string.\\nThis is a second sentence in the very long test string. This is a third\\nsentence in the very long test string.\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)psVar2;
  msg_13.m_begin = pvVar1;
  file_13.m_end = (iterator)0x409;
  file_13.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_338,
             msg_13);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_340 = "";
  in_12._M_str = 
  "This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string."
  ;
  in_12._M_len = 0x90;
  FormatParagraph_abi_cxx11_(&local_58,in_12,0x4f,0);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[145]>
            (&local_98,&local_348,0x409,1,2,psVar2,
             "FormatParagraph(\"This is a very long test string.\\n\\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.\", 79)"
             ,
             "This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string."
             ,
             "\"This is a very long test string.\\n\\nThis is a second sentence in the very long test string. This is a third\\nsentence in the very long test string.\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)psVar2;
  msg_14.m_begin = pvVar1;
  file_14.m_end = (iterator)0x40a;
  file_14.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_368,
             msg_14);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_370 = "";
  in_13._M_str = "Testing that normal newlines do not get indented.\nLike here.";
  in_13._M_len = 0x3c;
  FormatParagraph_abi_cxx11_(&local_58,in_13,0x4f,0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[61]>
            (&local_98,&local_378,0x40a,1,2,&local_58,
             "FormatParagraph(\"Testing that normal newlines do not get indented.\\nLike here.\", 79)"
             ,"Testing that normal newlines do not get indented.\nLike here.",
             "\"Testing that normal newlines do not get indented.\\nLike here.\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_FormatParagraph)
{
    BOOST_CHECK_EQUAL(FormatParagraph("", 79, 0), "");
    BOOST_CHECK_EQUAL(FormatParagraph("test", 79, 0), "test");
    BOOST_CHECK_EQUAL(FormatParagraph(" test", 79, 0), " test");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 79, 0), "test test");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 4, 0), "test\ntest");
    BOOST_CHECK_EQUAL(FormatParagraph("testerde test", 4, 0), "testerde\ntest");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 4, 4), "test\n    test");

    // Make sure we don't indent a fully-new line following a too-long line ending
    BOOST_CHECK_EQUAL(FormatParagraph("test test\nabc", 4, 4), "test\n    test\nabc");

    BOOST_CHECK_EQUAL(FormatParagraph("This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length until it gets here", 79), "This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\nuntil it gets here");

    // Test wrap length is exact
    BOOST_CHECK_EQUAL(FormatParagraph("a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p", 79), "a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p");
    BOOST_CHECK_EQUAL(FormatParagraph("x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p", 79), "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p");
    // Indent should be included in length of lines
    BOOST_CHECK_EQUAL(FormatParagraph("x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg h i j k", 79, 4), "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\n    h i j k");

    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string. This is a second sentence in the very long test string.", 79), "This is a very long test string. This is a second sentence in the very long\ntest string.");
    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string.\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.", 79), "This is a very long test string.\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string.");
    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.", 79), "This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string.");
    BOOST_CHECK_EQUAL(FormatParagraph("Testing that normal newlines do not get indented.\nLike here.", 79), "Testing that normal newlines do not get indented.\nLike here.");
}